

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O2

void __thiscall
kratos::InsertClockIRVisitor::visit(InsertClockIRVisitor *this,SequentialStmtBlock *block)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer psVar1;
  pointer psVar2;
  bool bVar3;
  Generator *pGVar4;
  __shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> local_88 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  undefined1 local_78 [8];
  shared_ptr<kratos::IfStmt> new_if;
  shared_ptr<kratos::Port> clk_en;
  shared_ptr<kratos::Stmt> first_stmt;
  shared_ptr<kratos::Var> cond;
  shared_ptr<kratos::IfStmt> if_;
  
  if (this->clk_en_ == (Port *)0x0) {
    return;
  }
  bVar3 = has_don_touch((IRNode *)block);
  if (bVar3) {
    return;
  }
  pGVar4 = Stmt::generator_parent((Stmt *)block);
  bVar3 = has_don_touch(&pGVar4->super_IRNode);
  if (bVar3) {
    return;
  }
  psVar1 = (block->super_StmtBlock).stmts_.
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (block->super_StmtBlock).stmts_.
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pGVar4 = Stmt::generator_parent((Stmt *)block);
  Generator::get_port((Generator *)
                      &new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,(string *)pGVar4);
  if (psVar2 == psVar1) goto LAB_001ad0d9;
  std::__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2> *)
             &clk_en.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &((block->super_StmtBlock).stmts_.
               super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>);
  if (((long)psVar2 - (long)psVar1 == 0x10) &&
     (clk_en.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[7].
      _M_use_count == 0)) {
    Stmt::as<kratos::IfStmt>
              ((Stmt *)&cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &first_stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               (cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
               0xc));
    bVar3 = has_port_type((Var *)first_stmt.
                                 super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi,AsyncReset);
    if ((!bVar3) &&
       (bVar3 = has_port_type((Var *)first_stmt.
                                     super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi,Reset), !bVar3)) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cond);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&if_);
      goto LAB_001ad07b;
    }
    bVar3 = has_clk_en_stmt(this,(StmtBlock *)
                                 cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi[0xf]._vptr__Sp_counted_base);
    if (!bVar3) {
      create_if_stmt_wrapper
                ((StmtBlock *)local_78,
                 (Port *)cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi[0xf]._vptr__Sp_counted_base,
                 (bool)new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._0_1_);
      (**(code **)(*cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi[0xf]._vptr__Sp_counted_base + 0x60))();
      std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::IfStmt,void>
                (local_88,(__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)local_78);
      IfStmt::add_else_stmt
                ((IfStmt *)
                 cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
                 (shared_ptr<kratos::Stmt> *)local_88);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&new_if);
    }
LAB_001ad0be:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&cond);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&if_);
  }
  else {
LAB_001ad07b:
    bVar3 = has_clk_en_stmt(this,&block->super_StmtBlock);
    if (!bVar3) {
      create_if_stmt_wrapper
                ((StmtBlock *)
                 &cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (Port *)block,
                 (bool)new_if.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._0_1_);
      (*(block->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xc])(block);
      this_00 = &first_stmt.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ;
      std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::IfStmt,void>
                ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)this_00,
                 (__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)
                 &cond.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      StmtBlock::add_stmt(&block->super_StmtBlock,(shared_ptr<kratos::Stmt> *)this_00);
      goto LAB_001ad0be;
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&first_stmt);
LAB_001ad0d9:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&clk_en);
  return;
}

Assistant:

void visit(SequentialStmtBlock* block) override {
        if (!clk_en_) return;
        if (has_don_touch(block)) return;
        auto* gen = block->generator_parent();
        if (has_don_touch(gen)) return;
        auto num_stmts = block->size();
        auto* generator = block->generator_parent();
        auto clk_en = generator->get_port(clk_en_name_);
        if (num_stmts > 0) {
            // we need to be careful about async reset logic
            auto first_stmt = block->get_stmt(0);
            if (num_stmts == 1 && first_stmt->type() == StatementType::If) {
                // async reset?
                auto if_ = first_stmt->as<IfStmt>();
                auto cond = if_->predicate();
                if (has_port_type(cond.get(), PortType::AsyncReset) ||
                    has_port_type(cond.get(), PortType::Reset)) {
                    if (!has_clk_en_stmt(if_->else_body().get())) {
                        auto new_if = create_if_stmt_wrapper(if_->else_body().get(), *clk_en, true);
                        if_->else_body()->clear();
                        if_->add_else_stmt(new_if);
                    }
                    return;
                }
            }
            // put everything into one block
            // if not clk enabled already
            if (!has_clk_en_stmt(block)) {
                auto if_ = create_if_stmt_wrapper(block, *clk_en, true);
                block->clear();
                block->add_stmt(if_);
            }
        }
    }